

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
::sparse_hashtable(sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                   *this,size_type expected_max_items_in_table,HashFn *hf,
                  equal_to<HashObject<4,_4>_> *eql,SelectKey *ext,SetKey *set,
                  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *alloc)

{
  long in_RSI;
  sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4> *in_RDI;
  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *in_stack_00000008;
  equal_to<HashObject<4,_4>_> *in_stack_ffffffffffffff78;
  SetKey *in_stack_ffffffffffffff80;
  SelectKey *in_stack_ffffffffffffff88;
  KeyInfo *in_stack_ffffffffffffff90;
  size_type local_60;
  sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  *min_buckets_wanted;
  size_type in_stack_ffffffffffffffb8;
  sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> local_31 [33];
  long local_10;
  
  local_10 = in_RSI;
  Settings::Settings((Settings *)in_stack_ffffffffffffff80,(hasher *)in_stack_ffffffffffffff78);
  KeyInfo::KeyInfo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff78);
  in_RDI[1].shrink_threshold_ = 0;
  min_buckets_wanted =
       (sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)&in_RDI[1].enlarge_factor_;
  if (local_10 == 0) {
    local_60 = 0x20;
  }
  else {
    local_60 = sparsehash_internal::
               sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>::min_buckets
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (size_type)min_buckets_wanted);
  }
  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>::libc_allocator_with_realloc
            (local_31,in_stack_00000008);
  sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::sparsetable(min_buckets_wanted,local_60,local_31);
  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>::~libc_allocator_with_realloc
            (local_31);
  bucket_count((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                *)0x1e3c39);
  sparsehash_internal::sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>::
  reset_thresholds(in_RDI,(size_type)in_stack_ffffffffffffff78);
  return;
}

Assistant:

explicit sparse_hashtable(size_type expected_max_items_in_table = 0,
                            const HashFcn& hf = HashFcn(),
                            const EqualKey& eql = EqualKey(),
                            const ExtractKey& ext = ExtractKey(),
                            const SetKey& set = SetKey(),
                            const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        table((expected_max_items_in_table == 0
                   ? HT_DEFAULT_STARTING_BUCKETS
                   : settings.min_buckets(expected_max_items_in_table, 0)),
              alloc) {
    settings.reset_thresholds(bucket_count());
  }